

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.cpp
# Opt level: O1

void __thiscall chrono::ChLineShape::ArchiveOUT(ChLineShape *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLineShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gline;
  local_28._name = "gline";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChLine>(marchive,&local_28);
  return;
}

Assistant:

void ChLineShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLineShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(gline);
}